

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_dist.h
# Opt level: O2

double manifold::DistanceTriangleTriangleSquared
                 (array<linalg::vec<double,_3>,_3UL> *p,array<linalg::vec<double,_3>,_3UL> *q)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  double dVar6;
  double dVar7;
  uint uVar8;
  ulong in_RAX;
  ulong extraout_RAX;
  ulong uVar9;
  bool bVar10;
  undefined4 uVar11;
  uint uVar12;
  long lVar13;
  vec3 *pvVar14;
  ulong uVar15;
  vec<double,_3> *pvVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar28;
  undefined1 auVar27 [16];
  vec3 cp;
  double local_130;
  vec3 cq;
  vec3 local_e8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  vec3 local_98;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  
  local_68 = p->_M_elems[0].x;
  dStack_60 = p->_M_elems[0].y;
  local_78 = p->_M_elems[1].y;
  local_98.x = p->_M_elems[1].x - local_68;
  local_98.y = local_78 - dStack_60;
  dStack_70 = p->_M_elems[1].z;
  dVar18 = p->_M_elems[2].x;
  local_98.z = dStack_70 - p->_M_elems[0].z;
  dStack_80 = dVar18 - p->_M_elems[1].x;
  dVar19 = p->_M_elems[2].y;
  local_58 = p->_M_elems[2].z;
  local_78 = dVar19 - local_78;
  dStack_70 = local_58 - dStack_70;
  local_58 = p->_M_elems[0].z - local_58;
  local_68 = local_68 - dVar18;
  dStack_60 = dStack_60 - dVar19;
  local_b8 = q->_M_elems[0].x;
  dStack_b0 = q->_M_elems[0].y;
  local_c8 = q->_M_elems[1].y;
  local_e8.x = q->_M_elems[1].x - local_b8;
  local_e8.y = local_c8 - dStack_b0;
  dStack_c0 = q->_M_elems[1].z;
  dVar18 = q->_M_elems[2].x;
  local_e8.z = dStack_c0 - q->_M_elems[0].z;
  dStack_d0 = dVar18 - q->_M_elems[1].x;
  dVar19 = q->_M_elems[2].y;
  local_a8 = q->_M_elems[2].z;
  local_c8 = dVar19 - local_c8;
  dStack_c0 = local_a8 - dStack_c0;
  local_a8 = q->_M_elems[0].z - local_a8;
  local_b8 = local_b8 - dVar18;
  dStack_b0 = dStack_b0 - dVar19;
  local_130 = 1.79769313486232e+308;
  bVar10 = false;
  for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
    in_RAX = (ulong)((int)lVar13 - 1);
    if (lVar13 == 0) {
      in_RAX = 2;
    }
    pvVar16 = p->_M_elems + in_RAX;
    uVar15 = 0xffffffff;
    for (lVar17 = 0; lVar17 != 0x48; lVar17 = lVar17 + 0x18) {
      cp.z = 0.0;
      cq.z = 0.0;
      cp.x = 0.0;
      cp.y = 0.0;
      cq.x = 0.0;
      cq.y = 0.0;
      EdgeEdgeDist(&cp,&cq,p->_M_elems + lVar13,&local_98 + lVar13,
                   (vec3 *)((long)&q->_M_elems[0].x + lVar17),(vec3 *)((long)&local_e8.x + lVar17));
      dVar19 = cq.y - cp.y;
      dVar21 = cq.x - cp.x;
      dVar22 = cq.z - cp.z;
      dVar18 = dVar22 * dVar22 + dVar19 * dVar19 + dVar21 * dVar21;
      in_RAX = extraout_RAX;
      if (dVar18 <= local_130) {
        uVar9 = uVar15 & 0xffffffff;
        if (lVar17 == 0) {
          uVar9 = 2;
        }
        dVar23 = dVar21 * (pvVar16->x - cp.x) + 0.0 + dVar19 * (pvVar16->y - cp.y) +
                 dVar22 * (pvVar16->z - cp.z);
        dVar19 = dVar21 * (q->_M_elems[uVar9].x - cq.x) + 0.0 +
                 dVar19 * (q->_M_elems[uVar9].y - cq.y) + dVar22 * (q->_M_elems[uVar9].z - cq.z);
        if ((dVar23 <= 0.0) && (0.0 <= dVar19)) {
          return dVar18;
        }
        if (dVar23 <= 0.0) {
          dVar23 = 0.0;
        }
        else if (0.0 < dVar19) {
          dVar19 = 0.0;
        }
        bVar5 = 0.0 < dVar19 + (dVar18 - dVar23);
        in_RAX = CONCAT71((int7)(uVar9 * 0x18 >> 8),bVar5);
        bVar10 = (bool)(bVar10 | bVar5);
        local_130 = dVar18;
      }
      uVar15 = uVar15 + 1;
    }
  }
  dVar19 = local_98.z * dStack_80 - dStack_70 * local_98.x;
  dVar21 = local_98.x * local_78 - local_98.y * dStack_80;
  dVar22 = local_98.y * dStack_70 - local_98.z * local_78;
  dVar18 = dVar22 * dVar22 + dVar19 * dVar19 + dVar21 * dVar21;
  uVar11 = 3;
  if (1e-15 < dVar18) {
    dVar23 = p->_M_elems[0].x;
    dVar6 = p->_M_elems[0].y;
    dVar7 = p->_M_elems[0].z;
    cp.x = dVar21 * (dVar7 - q->_M_elems[0].z) +
           (dVar23 - q->_M_elems[0].x) * dVar22 + 0.0 + dVar19 * (dVar6 - q->_M_elems[0].y);
    cp.y = (dVar23 - q->_M_elems[1].x) * dVar22 + 0.0 + dVar19 * (dVar6 - q->_M_elems[1].y) +
           (dVar7 - q->_M_elems[1].z) * dVar21;
    cp.z = (dVar23 - q->_M_elems[2].x) * dVar22 + 0.0 + dVar19 * (dVar6 - q->_M_elems[2].y) +
           (dVar7 - q->_M_elems[2].z) * dVar21;
    if (((cp.x <= 0.0) || (cp.y <= 0.0)) || (cp.z <= 0.0)) {
      if (cp.x < 0.0) {
        auVar26._8_8_ = -(ulong)(cp.z < 0.0);
        auVar26._0_8_ = -(ulong)(cp.y < 0.0);
        uVar8 = movmskpd((int)in_RAX,auVar26);
        if (((uVar8 & 1) != 0) && ((byte)((byte)uVar8 >> 1) != 0)) {
          bVar10 = cp.x <= cp.y;
          pvVar14 = (vec3 *)&cp.y;
          if (cp.y < cp.x) {
            pvVar14 = &cp;
          }
          if (cp.z < pvVar14->x || cp.z == pvVar14->x) goto LAB_001389e6;
          goto LAB_0013899b;
        }
      }
    }
    else {
      bVar10 = cp.y <= cp.x;
      pvVar14 = (vec3 *)&cp.y;
      if (cp.x < cp.y) {
        pvVar14 = &cp;
      }
      if (pvVar14->x <= cp.z) {
LAB_001389e6:
        uVar8 = (uint)bVar10;
      }
      else {
LAB_0013899b:
        uVar8 = 2;
      }
      dVar28 = q->_M_elems[uVar8].x;
      pdVar1 = &q->_M_elems[uVar8].y;
      dVar20 = *pdVar1;
      dVar24 = pdVar1[1];
      bVar10 = true;
      uVar11 = 1;
      if (0.0 < (dVar22 * local_98.y - local_98.x * dVar19) * (dVar24 - dVar7) +
                (dVar19 * local_98.z - local_98.y * dVar21) * (dVar28 - dVar23) + 0.0 +
                (dVar21 * local_98.x - local_98.z * dVar22) * (dVar20 - dVar6)) {
        if ((0.0 < (local_78 * dVar22 + dStack_80 * -dVar19) * (dVar24 - p->_M_elems[1].z) +
                   (dStack_70 * dVar19 + local_78 * -dVar21) * (dVar28 - p->_M_elems[1].x) + 0.0 +
                   (dStack_80 * dVar21 + dStack_70 * -dVar22) * (dVar20 - p->_M_elems[1].y)) &&
           (0.0 < (dStack_60 * dVar22 + local_68 * -dVar19) * (dVar24 - p->_M_elems[2].z) +
                  (dVar19 * local_58 + dStack_60 * -dVar21) * (dVar28 - p->_M_elems[2].x) + 0.0 +
                  (local_68 * dVar21 + local_58 * -dVar22) * (dVar20 - p->_M_elems[2].y))) {
          lVar13 = 0;
          if (uVar8 != 0) {
            lVar13 = (ulong)(uVar8 != 1) * 8 + 8;
          }
          dVar23 = *(double *)((long)&cp.x + lVar13);
          dVar20 = ((dVar19 * dVar23) / dVar18 + dVar20) - dVar20;
          auVar25._0_8_ = dVar21 * dVar23;
          auVar25._8_8_ = dVar22 * dVar23;
          auVar2._8_8_ = dVar18;
          auVar2._0_8_ = dVar18;
          auVar26 = divpd(auVar25,auVar2);
          dVar24 = (auVar26._0_8_ + dVar24) - dVar24;
          dVar28 = (auVar26._8_8_ + dVar28) - dVar28;
          return dVar28 * dVar28 + dVar20 * dVar20 + dVar24 * dVar24;
        }
      }
    }
  }
  dVar18 = local_e8.z * dStack_d0 - dStack_c0 * local_e8.x;
  dVar21 = local_e8.x * local_c8 - local_e8.y * dStack_d0;
  dVar22 = local_e8.y * dStack_c0 - local_e8.z * local_c8;
  dVar19 = dVar22 * dVar22 + dVar18 * dVar18 + dVar21 * dVar21;
  if (dVar19 <= 1e-15) goto LAB_00139058;
  uVar8 = 2;
  dVar23 = q->_M_elems[0].x;
  dVar6 = q->_M_elems[0].y;
  dVar7 = q->_M_elems[0].z;
  cp.x = dVar21 * (dVar7 - p->_M_elems[0].z) +
         (dVar23 - p->_M_elems[0].x) * dVar22 + 0.0 + dVar18 * (dVar6 - p->_M_elems[0].y);
  cp.y = (dVar23 - p->_M_elems[1].x) * dVar22 + 0.0 + dVar18 * (dVar6 - p->_M_elems[1].y) +
         (dVar7 - p->_M_elems[1].z) * dVar21;
  cp.z = (dVar23 - p->_M_elems[2].x) * dVar22 + 0.0 + dVar18 * (dVar6 - p->_M_elems[2].y) +
         (dVar7 - p->_M_elems[2].z) * dVar21;
  if (((cp.x <= 0.0) || (cp.y <= 0.0)) || (cp.z <= 0.0)) {
    if (0.0 <= cp.x) goto LAB_00139058;
    auVar4._8_8_ = -(ulong)(cp.z < 0.0);
    auVar4._0_8_ = -(ulong)(cp.y < 0.0);
    uVar12 = movmskpd(uVar11,auVar4);
    if (((uVar12 & 1) == 0) || ((byte)((byte)uVar12 >> 1) == 0)) goto LAB_00139058;
    bVar10 = cp.x <= cp.y;
    pvVar14 = &cp;
    if (cp.x <= cp.y) {
      pvVar14 = (vec3 *)&cp.y;
    }
    if (cp.z < pvVar14->x || cp.z == pvVar14->x) goto LAB_00138dec;
  }
  else {
    bVar10 = cp.y <= cp.x;
    pvVar14 = &cp;
    if (cp.y <= cp.x) {
      pvVar14 = (vec3 *)&cp.y;
    }
    if (pvVar14->x <= cp.z) {
LAB_00138dec:
      uVar8 = (uint)bVar10;
    }
  }
  dVar28 = p->_M_elems[uVar8].x;
  pdVar1 = &p->_M_elems[uVar8].y;
  dVar20 = *pdVar1;
  dVar24 = pdVar1[1];
  bVar10 = true;
  if (0.0 < (dVar22 * local_e8.y - local_e8.x * dVar18) * (dVar24 - dVar7) +
            (dVar18 * local_e8.z - local_e8.y * dVar21) * (dVar28 - dVar23) + 0.0 +
            (dVar21 * local_e8.x - local_e8.z * dVar22) * (dVar20 - dVar6)) {
    if ((0.0 < (local_c8 * dVar22 + dStack_d0 * -dVar18) * (dVar24 - q->_M_elems[1].z) +
               (dStack_c0 * dVar18 + local_c8 * -dVar21) * (dVar28 - q->_M_elems[1].x) + 0.0 +
               (dStack_d0 * dVar21 + dStack_c0 * -dVar22) * (dVar20 - q->_M_elems[1].y)) &&
       (0.0 < (dStack_b0 * dVar22 + local_b8 * -dVar18) * (dVar24 - q->_M_elems[2].z) +
              (dVar18 * local_a8 + dStack_b0 * -dVar21) * (dVar28 - q->_M_elems[2].x) + 0.0 +
              (local_b8 * dVar21 + local_a8 * -dVar22) * (dVar20 - q->_M_elems[2].y))) {
      lVar13 = 0;
      if (uVar8 != 0) {
        lVar13 = (ulong)(uVar8 != 1) * 8 + 8;
      }
      dVar23 = *(double *)((long)&cp.x + lVar13);
      dVar20 = dVar20 - ((dVar18 * dVar23) / dVar19 + dVar20);
      auVar27._0_8_ = dVar21 * dVar23;
      auVar27._8_8_ = dVar22 * dVar23;
      auVar3._8_8_ = dVar19;
      auVar3._0_8_ = dVar19;
      auVar26 = divpd(auVar27,auVar3);
      dVar24 = dVar24 - (auVar26._0_8_ + dVar24);
      dVar28 = dVar28 - (auVar26._8_8_ + dVar28);
      return dVar28 * dVar28 + dVar20 * dVar20 + dVar24 * dVar24;
    }
  }
LAB_00139058:
  if (!bVar10) {
    local_130 = 0.0;
  }
  return local_130;
}

Assistant:

inline auto DistanceTriangleTriangleSquared(const std::array<vec3, 3>& p,
                                            const std::array<vec3, 3>& q) {
  std::array<vec3, 3> Sv;
  Sv[0] = p[1] - p[0];
  Sv[1] = p[2] - p[1];
  Sv[2] = p[0] - p[2];

  std::array<vec3, 3> Tv;
  Tv[0] = q[1] - q[0];
  Tv[1] = q[2] - q[1];
  Tv[2] = q[0] - q[2];

  bool shown_disjoint = false;

  auto mindd = std::numeric_limits<double>::max();

  for (uint32_t i = 0; i < 3; i++) {
    for (uint32_t j = 0; j < 3; j++) {
      vec3 cp;
      vec3 cq;
      EdgeEdgeDist(cp, cq, p[i], Sv[i], q[j], Tv[j]);
      const vec3 V = cq - cp;
      const auto dd = la::dot(V, V);

      if (dd <= mindd) {
        mindd = dd;

        uint32_t id = i + 2;
        if (id >= 3) id -= 3;
        vec3 Z = p[id] - cp;
        auto a = la::dot(Z, V);
        id = j + 2;
        if (id >= 3) id -= 3;
        Z = q[id] - cq;
        auto b = la::dot(Z, V);

        if ((a <= 0.0) && (b >= 0.0)) {
          return la::dot(V, V);
        };

        if (a <= 0.0)
          a = 0.0;
        else if (b > 0.0)
          b = 0.0;

        if ((mindd - a + b) > 0.0) shown_disjoint = true;
      }
    }
  }

  vec3 Sn = la::cross(Sv[0], Sv[1]);
  auto Snl = la::dot(Sn, Sn);

  if (Snl > 1e-15) {
    const vec3 Tp(la::dot(p[0] - q[0], Sn), la::dot(p[0] - q[1], Sn),
                  la::dot(p[0] - q[2], Sn));

    int index = -1;
    if ((Tp[0] > 0.0) && (Tp[1] > 0.0) && (Tp[2] > 0.0)) {
      index = Tp[0] < Tp[1] ? 0 : 1;
      if (Tp[2] < Tp[index]) index = 2;
    } else if ((Tp[0] < 0.0) && (Tp[1] < 0.0) && (Tp[2] < 0.0)) {
      index = Tp[0] > Tp[1] ? 0 : 1;
      if (Tp[2] > Tp[index]) index = 2;
    }

    if (index >= 0) {
      shown_disjoint = true;

      const vec3& qIndex = q[index];

      vec3 V = qIndex - p[0];
      vec3 Z = la::cross(Sn, Sv[0]);
      if (la::dot(V, Z) > 0.0) {
        V = qIndex - p[1];
        Z = la::cross(Sn, Sv[1]);
        if (la::dot(V, Z) > 0.0) {
          V = qIndex - p[2];
          Z = la::cross(Sn, Sv[2]);
          if (la::dot(V, Z) > 0.0) {
            vec3 cp = qIndex + Sn * Tp[index] / Snl;
            vec3 cq = qIndex;
            return la::dot(cp - cq, cp - cq);
          }
        }
      }
    }
  }

  vec3 Tn = la::cross(Tv[0], Tv[1]);
  auto Tnl = la::dot(Tn, Tn);

  if (Tnl > 1e-15) {
    const vec3 Sp(la::dot(q[0] - p[0], Tn), la::dot(q[0] - p[1], Tn),
                  la::dot(q[0] - p[2], Tn));

    int index = -1;
    if ((Sp[0] > 0.0) && (Sp[1] > 0.0) && (Sp[2] > 0.0)) {
      index = Sp[0] < Sp[1] ? 0 : 1;
      if (Sp[2] < Sp[index]) index = 2;
    } else if ((Sp[0] < 0.0) && (Sp[1] < 0.0) && (Sp[2] < 0.0)) {
      index = Sp[0] > Sp[1] ? 0 : 1;
      if (Sp[2] > Sp[index]) index = 2;
    }

    if (index >= 0) {
      shown_disjoint = true;

      const vec3& pIndex = p[index];

      vec3 V = pIndex - q[0];
      vec3 Z = la::cross(Tn, Tv[0]);
      if (la::dot(V, Z) > 0.0) {
        V = pIndex - q[1];
        Z = la::cross(Tn, Tv[1]);
        if (la::dot(V, Z) > 0.0) {
          V = pIndex - q[2];
          Z = la::cross(Tn, Tv[2]);
          if (la::dot(V, Z) > 0.0) {
            vec3 cp = pIndex;
            vec3 cq = pIndex + Tn * Sp[index] / Tnl;
            return la::dot(cp - cq, cp - cq);
          }
        }
      }
    }
  }

  return shown_disjoint ? mindd : 0.0;
}